

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  uchar uVar1;
  SySet *pSet;
  ulong uVar2;
  sxu32 sVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  void *pvVar6;
  SyToken *pLast;
  jx9_expr_op *pjVar7;
  bool bVar8;
  bool bVar9;
  jx9_expr_op *pOp;
  uchar *puStack_88;
  sxi32 i_1;
  uchar *zPtr_1;
  sxi32 iNest;
  sxi32 i;
  uchar *zPtr;
  char *zTypeCast;
  sxi32 nID;
  SyToken *pTmp;
  SySet *pTokSet;
  sxi32 c;
  sxu32 nKeyword;
  uchar *zIn;
  sxi32 rc;
  SyString *pStr;
  void *pCtxData_local;
  void *pUserData_local;
  SyToken *pToken_local;
  SyStream *pStream_local;
  
  while( true ) {
    bVar8 = false;
    if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
      ppuVar5 = __ctype_b_loc();
      bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x2000) != 0;
    }
    if (!bVar8) break;
    if (*pStream->zText == '\n') {
      pStream->nLine = pStream->nLine + 1;
    }
    pStream->zText = pStream->zText + 1;
  }
  if (pStream->zEnd <= pStream->zText) {
    return -0x12;
  }
  pToken->nLine = pStream->nLine;
  pToken->pUserData = (void *)0x0;
  (pToken->sData).zString = (char *)pStream->zText;
  (pToken->sData).nByte = 0;
  if (((*pStream->zText < 0xc0) &&
      (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x400) == 0)) &&
     (*pStream->zText != '_')) {
    if ((*pStream->zText == '#') ||
       (((*pStream->zText == '/' && (pStream->zText + 1 < pStream->zEnd)) &&
        (pStream->zText[1] == '/')))) {
      pStream->zText = pStream->zText + 1;
      while( true ) {
        bVar8 = false;
        if (pStream->zText < pStream->zEnd) {
          bVar8 = *pStream->zText != '\n';
        }
        if (!bVar8) break;
        pStream->zText = pStream->zText + 1;
      }
      return -0x19;
    }
    if (((*pStream->zText == '/') && (pStream->zText + 1 < pStream->zEnd)) &&
       (pStream->zText[1] == '*')) {
      pStream->zText = pStream->zText + 2;
      while ((pStream->zText < pStream->zEnd &&
             ((*pStream->zText != '*' ||
              ((pStream->zText + 1 < pStream->zEnd && (pStream->zText[1] != '/'))))))) {
        if (*pStream->zText == '\n') {
          pStream->nLine = pStream->nLine + 1;
        }
        pStream->zText = pStream->zText + 1;
      }
      pStream->zText = pStream->zText + 2;
      return -0x19;
    }
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)*pStream->zText] & 0x800) != 0) {
      pStream->zText = pStream->zText + 1;
      while( true ) {
        bVar8 = false;
        if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
          ppuVar5 = __ctype_b_loc();
          bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x800) != 0;
        }
        if (!bVar8) break;
        pStream->zText = pStream->zText + 1;
      }
      pToken->nType = 1;
      if (pStream->zText < pStream->zEnd) {
        uVar1 = *pStream->zText;
        if (uVar1 == '.') {
          pStream->zText = pStream->zText + 1;
          while( true ) {
            bVar8 = false;
            if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
              ppuVar5 = __ctype_b_loc();
              bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x800) != 0;
            }
            if (!bVar8) break;
            pStream->zText = pStream->zText + 1;
          }
          if ((pStream->zText < pStream->zEnd) &&
             (((*pStream->zText == 'e' || (*pStream->zText == 'E')) &&
              (pStream->zText = pStream->zText + 1, pStream->zText < pStream->zEnd)))) {
            if ((((*pStream->zText == '+') || (*pStream->zText == '-')) &&
                (pStream->zText + 1 < pStream->zEnd)) &&
               ((pStream->zText[1] < 0xc0 &&
                (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)pStream->zText[1]] & 0x800) != 0)
                ))) {
              pStream->zText = pStream->zText + 1;
            }
            while( true ) {
              bVar8 = false;
              if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
                ppuVar5 = __ctype_b_loc();
                bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x800) != 0;
              }
              if (!bVar8) break;
              pStream->zText = pStream->zText + 1;
            }
          }
          pToken->nType = 2;
        }
        else if ((uVar1 == 'e') || (uVar1 == 'E')) {
          pStream->zText = pStream->zText + 1;
          if (pStream->zText < pStream->zEnd) {
            if ((((*pStream->zText == '+') || (*pStream->zText == '-')) &&
                (pStream->zText + 1 < pStream->zEnd)) &&
               ((pStream->zText[1] < 0xc0 &&
                (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)pStream->zText[1]] & 0x800) != 0)
                ))) {
              pStream->zText = pStream->zText + 1;
            }
            while( true ) {
              bVar8 = false;
              if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
                ppuVar5 = __ctype_b_loc();
                bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x800) != 0;
              }
              if (!bVar8) break;
              pStream->zText = pStream->zText + 1;
            }
          }
          pToken->nType = 2;
        }
        else if ((uVar1 == 'x') || (uVar1 == 'X')) {
          pStream->zText = pStream->zText + 1;
          while( true ) {
            bVar8 = false;
            if ((pStream->zText < pStream->zEnd) && (bVar8 = false, *pStream->zText < 0xc0)) {
              ppuVar5 = __ctype_b_loc();
              bVar8 = ((*ppuVar5)[(int)(uint)*pStream->zText] & 0x1000) != 0;
            }
            if (!bVar8) break;
            pStream->zText = pStream->zText + 1;
          }
        }
        else if ((uVar1 == 'b') || (uVar1 == 'B')) {
          pStream->zText = pStream->zText + 1;
          while( true ) {
            bVar8 = false;
            if ((pStream->zText < pStream->zEnd) && (bVar8 = true, *pStream->zText != '0')) {
              bVar8 = *pStream->zText == '1';
            }
            if (!bVar8) break;
            pStream->zText = pStream->zText + 1;
          }
        }
      }
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
      return 0;
    }
    uVar1 = *pStream->zText;
    pStream->zText = pStream->zText + 1;
    pToken->nType = 0x20;
    switch(uVar1) {
    case '!':
      if (((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) &&
         ((pStream->zText = pStream->zText + 1, pStream->zText < pStream->zEnd &&
          (*pStream->zText == '=')))) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case '\"':
      (pToken->sData).zString = (pToken->sData).zString + 1;
      while (pStream->zText < pStream->zEnd) {
        if (((*pStream->zText == '{') && (pStream->zText + 1 < pStream->zEnd)) &&
           (pStream->zText[1] == '$')) {
          zPtr_1._0_4_ = 1;
          pStream->zText = pStream->zText + 1;
          while (pStream->zText < pStream->zEnd) {
            if (*pStream->zText == '{') {
              zPtr_1._0_4_ = (int)zPtr_1 + 1;
            }
            else if (*pStream->zText == '}') {
              zPtr_1._0_4_ = (int)zPtr_1 + -1;
              if ((int)zPtr_1 < 1) {
                pStream->zText = pStream->zText + 1;
                break;
              }
            }
            else if (*pStream->zText == '\n') {
              pStream->nLine = pStream->nLine + 1;
            }
            pStream->zText = pStream->zText + 1;
          }
          if (pStream->zEnd <= pStream->zText) break;
        }
        if (*pStream->zText == '\"') {
          if (pStream->zText[-1] != '\\') break;
          puStack_88 = pStream->zText + -2;
          bVar8 = true;
          while( true ) {
            bVar9 = false;
            if (pStream->zInput < puStack_88) {
              bVar9 = *puStack_88 == '\\';
            }
            if (!bVar9) break;
            puStack_88 = puStack_88 + -1;
            bVar8 = (bool)(bVar8 ^ 1);
          }
          if (!bVar8) break;
        }
        if (*pStream->zText == '\n') {
          pStream->nLine = pStream->nLine + 1;
        }
        pStream->zText = pStream->zText + 1;
      }
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
      pToken->nType = 0x2000;
      pStream->zText = pStream->zText + 1;
      return 0;
    default:
      break;
    case '$':
      pToken->nType = 0x10;
      break;
    case '%':
      if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case '&':
      pToken->nType = pToken->nType | 0x200000;
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '&') {
          pToken->nType = pToken->nType & 0xffdfffff;
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '=') {
          pToken->nType = pToken->nType & 0xffdfffff;
          pStream->zText = pStream->zText + 1;
        }
      }
    case '.':
      if ((pStream->zText < pStream->zEnd) && ((*pStream->zText == '.' || (*pStream->zText == '=')))
         ) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case '\'':
      (pToken->sData).zString = (pToken->sData).zString + 1;
      while (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '\'') {
          if (pStream->zText[-1] != '\\') break;
          _iNest = pStream->zText + -2;
          bVar8 = true;
          while( true ) {
            bVar9 = false;
            if (pStream->zInput < _iNest) {
              bVar9 = *_iNest == '\\';
            }
            if (!bVar9) break;
            _iNest = _iNest + -1;
            bVar8 = (bool)(bVar8 ^ 1);
          }
          if (!bVar8) break;
        }
        if (*pStream->zText == '\n') {
          pStream->nLine = pStream->nLine + 1;
        }
        pStream->zText = pStream->zText + 1;
      }
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
      pToken->nType = 0x4000;
      pStream->zText = pStream->zText + 1;
      return 0;
    case '(':
      pToken->nType = 0x200;
      break;
    case ')':
      pSet = pStream->pSet;
      if ((((1 < pSet->nUsed) &&
           (pvVar6 = SySetPeek(pSet), (*(uint *)((long)pvVar6 + 0x10) & 4) != 0)) &&
          (uVar2 = *(ulong *)((long)pvVar6 + 0x18), (uVar2 & 0x78000) != 0)) &&
         (pvVar6 = SySetAt(pSet,pSet->nUsed - 2), (*(uint *)((long)pvVar6 + 0x10) & 0x200) != 0)) {
        zPtr = "(int)";
        if ((uVar2 & 0x20000) == 0) {
          if ((uVar2 & 0x8000) == 0) {
            if ((uVar2 & 0x40000) != 0) {
              zPtr = "(string)";
            }
          }
          else {
            zPtr = "(bool)";
          }
        }
        else {
          zPtr = "(float)";
        }
        pToken->nType = 0x20;
        (pToken->sData).zString = (char *)zPtr;
        sVar3 = SyStrlen((char *)zPtr);
        (pToken->sData).nByte = sVar3;
        pjVar7 = jx9ExprExtractOperator(&pToken->sData,(SyToken *)0x0);
        pToken->pUserData = pjVar7;
        pSet->nUsed = pSet->nUsed - 2;
        return 0;
      }
      pToken->nType = 0x400;
      break;
    case '*':
      if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case '+':
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '+') {
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '=') {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case ',':
      pToken->nType = pToken->nType | 0x20000;
      break;
    case '-':
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '-') {
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '=') {
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '>') {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case '/':
      if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case ':':
      pToken->nType = 0x100000;
      break;
    case ';':
      pToken->nType = 0x40000;
      break;
    case '<':
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '<') {
          pStream->zText = pStream->zText + 1;
          if (pStream->zText < pStream->zEnd) {
            if (*pStream->zText == '=') {
              pStream->zText = pStream->zText + 1;
            }
            else if (*pStream->zText == '<') {
              pStream->zText = pStream->zText + 1;
              sVar4 = LexExtractNowdoc(pStream,pToken);
              if (sVar4 == 0) {
                return 0;
              }
            }
          }
        }
        else if (*pStream->zText == '>') {
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '=') {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case '=':
      pToken->nType = pToken->nType | 0x400000;
      if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
        pToken->nType = pToken->nType & 0xffbfffff;
        pStream->zText = pStream->zText + 1;
        if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case '>':
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '>') {
          pStream->zText = pStream->zText + 1;
          if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
            pStream->zText = pStream->zText + 1;
          }
        }
        else if (*pStream->zText == '=') {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case '[':
      pToken->nType = pToken->nType | 0x800;
      break;
    case ']':
      pToken->nType = 0x1000;
      break;
    case '^':
      if ((pStream->zText < pStream->zEnd) && (*pStream->zText == '=')) {
        pStream->zText = pStream->zText + 1;
      }
      break;
    case '{':
      pToken->nType = 0x40;
      break;
    case '|':
      if (pStream->zText < pStream->zEnd) {
        if (*pStream->zText == '|') {
          pStream->zText = pStream->zText + 1;
        }
        else if (*pStream->zText == '=') {
          pStream->zText = pStream->zText + 1;
        }
      }
      break;
    case '}':
      pToken->nType = 0x80;
    }
    if ((pToken->sData).nByte == 0) {
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
    }
    if ((pToken->nType & 0x20) != 0) {
      pLast = (SyToken *)SySetPeek(pStream->pSet);
      pjVar7 = jx9ExprExtractOperator(&pToken->sData,pLast);
      if (pjVar7 == (jx9_expr_op *)0x0) {
        pToken->nType = pToken->nType & 0xffffffdf;
        if (pToken->nType == 0) {
          pToken->nType = 0x1000000;
        }
      }
      else {
        pToken->pUserData = pjVar7;
      }
    }
  }
  else {
    if (*pStream->zText < 0xc0) {
      pStream->zText = pStream->zText + 1;
    }
    while( true ) {
      _c = pStream->zText;
      if (0xbf < *_c) {
        do {
          _c = _c + 1;
          bVar8 = false;
          if (_c < pStream->zEnd) {
            bVar8 = (*_c & 0xc0) == 0x80;
          }
        } while (bVar8);
      }
      while( true ) {
        bVar8 = false;
        if ((_c < pStream->zEnd) && (bVar8 = false, *_c < 0xc0)) {
          ppuVar5 = __ctype_b_loc();
          bVar8 = true;
          if (((*ppuVar5)[(int)(uint)*_c] & 8) == 0) {
            bVar8 = *_c == 0x5f;
          }
        }
        if (!bVar8) break;
        _c = _c + 1;
      }
      if (_c == pStream->zText) break;
      pStream->zText = _c;
    }
    (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
    sVar3 = keywordCode((pToken->sData).zString,(pToken->sData).nByte);
    if (sVar3 == 8) {
      pToken->nType = 8;
    }
    else {
      pToken->nType = 4;
      pToken->pUserData = (void *)(ulong)sVar3;
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)
{
	SyString *pStr;
	sxi32 rc;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		sxu32 nKeyword;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		nKeyword = keywordCode(pStr->zString, (int)pStr->nByte);
		if( nKeyword != JX9_TK_ID ){
			/* We are dealing with a keyword [i.e: if, function, CREATE, ...], save the keyword ID */
			pToken->nType = JX9_TK_KEYWORD;
			pToken->pUserData = SX_INT_TO_PTR(nKeyword);
		}else{
			/* A simple identifier */
			pToken->nType = JX9_TK_ID;
		}
	}else{
		sxi32 c;
		/* Non-alpha stream */
		if( pStream->zText[0] == '#' || 
			( pStream->zText[0] == '/' &&  &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '/') ){
				pStream->zText++;
				/* Inline comments */
				while( pStream->zText < pStream->zEnd && pStream->zText[0] != '\n' ){
					pStream->zText++;
				}
				/* Tell the upper-layer to ignore this token */ 
				return SXERR_CONTINUE;
		}else if( pStream->zText[0] == '/' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '*' ){
			pStream->zText += 2;
			/* Block comment */
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '*' ){
					if( &pStream->zText[1] >= pStream->zEnd || pStream->zText[1] == '/'  ){
						break;
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			pStream->zText += 2;
			/* Tell the upper-layer to ignore this token */
			return SXERR_CONTINUE;
		}else if( SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
			/* Decimal digit stream */
			while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
				pStream->zText++;
			}
			/* Mark the token as integer until we encounter a real number */
			pToken->nType = JX9_TK_INTEGER;
			if( pStream->zText < pStream->zEnd ){
				c = pStream->zText[0];
				if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
									pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
										pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c=='e' || c=='E' ){
					SXUNUSED(pUserData); /* Prevent compiler warning */
					SXUNUSED(pCtxData);
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
							pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
								pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c == 'x' || c == 'X' ){
					/* Hex digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisHex(pStream->zText[0]) ){
						pStream->zText++;
					}
				}else if(c  == 'b' || c == 'B' ){
					/* Binary digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && (pStream->zText[0] == '0' || pStream->zText[0] == '1') ){
						pStream->zText++;
					}
				}
			}
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			return SXRET_OK;
		}
		c = pStream->zText[0];
		pStream->zText++; /* Advance the stream cursor */
		/* Assume we are dealing with an operator*/
		pToken->nType = JX9_TK_OP;
		switch(c){
		case '$': pToken->nType = JX9_TK_DOLLAR; break;
		case '{': pToken->nType = JX9_TK_OCB;   break; 
		case '}': pToken->nType = JX9_TK_CCB;    break;
		case '(': pToken->nType = JX9_TK_LPAREN; break; 
		case '[': pToken->nType |= JX9_TK_OSB;   break; /* Bitwise operation here, since the square bracket token '[' 
														 * is a potential operator [i.e: subscripting] */
		case ']': pToken->nType = JX9_TK_CSB;    break;
		case ')': {
			SySet *pTokSet = pStream->pSet;
			/* Assemble type cast operators [i.e: (int), (float), (bool)...] */ 
			if( pTokSet->nUsed >= 2 ){
				SyToken *pTmp;
				/* Peek the last recongnized token */
				pTmp = (SyToken *)SySetPeek(pTokSet);
				if( pTmp->nType & JX9_TK_KEYWORD ){
					sxi32 nID = SX_PTR_TO_INT(pTmp->pUserData);
					if( (sxu32)nID & (JX9_TKWRD_INT|JX9_TKWRD_FLOAT|JX9_TKWRD_STRING|JX9_TKWRD_BOOL) ){
						pTmp = (SyToken *)SySetAt(pTokSet, pTokSet->nUsed - 2);
						if( pTmp->nType & JX9_TK_LPAREN ){
							/* Merge the three tokens '(' 'TYPE' ')' into a single one */
							const char * zTypeCast = "(int)";
							if( nID & JX9_TKWRD_FLOAT ){
								zTypeCast = "(float)";
							}else if( nID & JX9_TKWRD_BOOL ){
								zTypeCast = "(bool)";
							}else if( nID & JX9_TKWRD_STRING ){
								zTypeCast = "(string)";
							}
							/* Reflect the change */
							pToken->nType = JX9_TK_OP;
							SyStringInitFromBuf(&pToken->sData, zTypeCast, SyStrlen(zTypeCast));
							/* Save the instance associated with the type cast operator */
							pToken->pUserData = (void *)jx9ExprExtractOperator(&pToken->sData, 0);
							/* Remove the two previous tokens */
							pTokSet->nUsed -= 2;
							return SXRET_OK;
						}
					}
				}
			}
			pToken->nType = JX9_TK_RPAREN;
			break;
				  }
		case '\'':{
			/* Single quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '\''  ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_SSTR;
			/* Jump the trailing single quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case '"':{
			sxi32 iNest;
			/* Double quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '{' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '$'){
					iNest = 1;
					pStream->zText++;
					/* TICKET 1433-40: Hnadle braces'{}' in double quoted string where everything is allowed */
					while(pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '{' ){
							iNest++;
						}else if (pStream->zText[0] == '}' ){
							iNest--;
							if( iNest <= 0 ){
								pStream->zText++;
								break;
							}
						}else if( pStream->zText[0] == '\n' ){
							pStream->nLine++;
						}
						pStream->zText++;
					}
					if( pStream->zText >= pStream->zEnd ){
						break;
					}
				}
				if( pStream->zText[0] == '"' ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_DSTR;
			/* Jump the trailing quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case ':':
			pToken->nType = JX9_TK_COLON; /* Single colon */
			break;
		case ',': pToken->nType |= JX9_TK_COMMA;  break; /* Comma is also an operator */
		case ';': pToken->nType = JX9_TK_SEMI;   break;
			/* Handle combined operators [i.e: +=, ===, !=== ...] */
		case '=':
			pToken->nType |= JX9_TK_EQUAL;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_EQUAL;
					/* Current operator: == */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: === */
						pStream->zText++;
					}
				}
			}
			break;
		case '!':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: != */
				pStream->zText++;
				if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
					/* Current operator: !== */
					pStream->zText++;
				}
			}
			break;
		case '&':
			pToken->nType |= JX9_TK_AMPER;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '&' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: && */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: &= */
					pStream->zText++;
				}
			}
		case '.':
			if( pStream->zText < pStream->zEnd && (pStream->zText[0] == '.' || pStream->zText[0] == '=') ){
				/* Concatenation operator: '..' or '.='  */
				pStream->zText++;
			}
			break;
		case '|':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '|' ){
					/* Current operator: || */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: |= */
					pStream->zText++;
				}
			}
			break;
		case '+':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '+' ){
					/* Current operator: ++ */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: += */
					pStream->zText++;
				}
			}
			break;
		case '-':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '-' ){
					/* Current operator: -- */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: -= */
					pStream->zText++;
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: -> */
					pStream->zText++;
				}
			}
			break;
		case '*':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: *= */
				pStream->zText++;
			}
			break;
		case '/':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: /= */
				pStream->zText++;
			}
			break;
		case '%':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: %= */
				pStream->zText++;
			}
			break;
		case '^':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: ^= */
				pStream->zText++;
			}
			break;
		case '<':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '<' ){
					/* Current operator: << */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '=' ){
							/* Current operator: <<= */
							pStream->zText++;
						}else if( pStream->zText[0] == '<' ){
							/* Current Token: <<<  */
							pStream->zText++;
							/* This may be the beginning of a Heredoc/Nowdoc string, try to delimit it */
							rc = LexExtractNowdoc(&(*pStream), &(*pToken));
							if( rc == SXRET_OK ){
								/* Here/Now doc successfuly extracted */
								return SXRET_OK;
							}
						}
					}
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: <> */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: <= */
					pStream->zText++;
				}
			}
			break;
		case '>':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '>' ){
					/* Current operator: >> */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: >>= */
						pStream->zText++;
					}
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: >= */
					pStream->zText++;
				}
			}
			break;
		default:
			break;
		}
		if( pStr->nByte <= 0 ){
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		}
		if( pToken->nType & JX9_TK_OP ){
			const jx9_expr_op *pOp;
			/* Check if the extracted token is an operator */
			pOp = jx9ExprExtractOperator(pStr, (SyToken *)SySetPeek(pStream->pSet));
			if( pOp == 0 ){
				/* Not an operator */
				pToken->nType &= ~JX9_TK_OP;
				if( pToken->nType <= 0 ){
					pToken->nType = JX9_TK_OTHER;
				}
			}else{
				/* Save the instance associated with this operator for later processing */
				pToken->pUserData = (void *)pOp;
			}
		}
	}
	/* Tell the upper-layer to save the extracted token for later processing */
	return SXRET_OK;
}